

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O1

int AF_A_PotteryChooseBit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  FState *pFVar8;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b9ca5;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar5 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar7 = (this->super_DThinker).super_DObject.Class;
      bVar10 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar5 = (uint)bVar10;
      pVVar9 = (VMValue *)(ulong)(pPVar7 == pPVar3 || bVar10);
      if (pPVar7 != pPVar3 && !bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b9ca5;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b9c7a;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b9ca5;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_2c.Index = 0x87;
      pFVar8 = AActor::FindState(this,&local_2c);
      uVar5 = FRandom::GenRand32(&pr_bit);
      AActor::SetState(this,pFVar8 + (ulong)(((uVar5 & 0xff) % 5) * 2) + 1,false);
      uVar5 = FRandom::GenRand32(&pr_bit);
      this->tics = (uVar5 & 0xff) * 2 + 0x100;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b9c7a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b9ca5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x60,"int AF_A_PotteryChooseBit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PotteryChooseBit)
{
	PARAM_ACTION_PROLOGUE;

	self->SetState (self->FindState(NAME_Death) + 1 + 2*(pr_bit()%5));
	self->tics = 256+(pr_bit()<<1);
	return 0;
}